

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O0

void XUtf8DrawImageString
               (Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,char *string
               ,int num_bytes)

{
  unsigned_long uVar1;
  int iVar2;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar3;
  undefined4 local_d0 [2];
  XGCValues xgcv;
  int function;
  unsigned_long background;
  unsigned_long foreground;
  int fill_style;
  int w;
  int y_local;
  int x_local;
  GC gc_local;
  XUtf8FontStruct *font_set_local;
  Drawable d_local;
  Display *display_local;
  
  uVar3 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  iVar2 = XUtf8TextWidth(font_set,string,num_bytes);
  XGetGCValues(display,gc,0x10d,local_d0);
  uVar1 = xgcv.plane_mask;
  xgcv.dashes = (char)local_d0[0];
  xgcv._125_3_ = local_d0[0]._1_3_;
  local_d0[0] = 3;
  xgcv.plane_mask = xgcv.foreground;
  xgcv.foreground = uVar1;
  xgcv.cap_style = 0;
  XChangeGC(display,gc,0x10d,local_d0);
  XFillRectangle(display,d,gc,x,y - font_set->ascent,iVar2,
                 CONCAT44(uVar3,font_set->ascent + font_set->descent));
  local_d0[0]._0_1_ = xgcv.dashes;
  local_d0[0]._1_3_ = xgcv._125_3_;
  XChangeGC(display,gc,0x10d,local_d0);
  XUtf8DrawString(display,d,font_set,gc,x,y,string,num_bytes);
  return;
}

Assistant:

void
XUtf8DrawImageString(Display         *display,
		     Drawable        d,
		     XUtf8FontStruct *font_set,
		     GC              gc,
		     int             x,
		     int             y,
		     const char      *string,
		     int             num_bytes) {

  /* FIXME: must be improved ! */
  int w;
  int fill_style;
  unsigned long foreground;
  unsigned long background;
  int function;
  XGCValues xgcv;

  w = XUtf8TextWidth(font_set, string, num_bytes);

  XGetGCValues(display, gc,
	       GCFunction|GCForeground|GCBackground|GCFillStyle, &xgcv);

  function = xgcv.function;
  fill_style = xgcv.fill_style;
  foreground = xgcv.foreground;
  background = xgcv.background;

  xgcv.function = GXcopy;
  xgcv.foreground = background;
  xgcv.background = foreground;
  xgcv.fill_style = FillSolid;

  XChangeGC(display, gc,
	    GCFunction|GCForeground|GCBackground|GCFillStyle, &xgcv);

  XFillRectangle(display, d, gc, x, y - font_set->ascent,
	         (unsigned)w, (unsigned)(font_set->ascent + font_set->descent));

  xgcv.function = function;
  xgcv.foreground = foreground;
  xgcv.background = background;
  xgcv.fill_style = fill_style;

  XChangeGC(display, gc,
	    GCFunction|GCForeground|GCBackground|GCFillStyle, &xgcv);

  XUtf8DrawString(display, d, font_set, gc, x, y, string, num_bytes);
}